

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Eq_i32_(w3Interp *this)

{
  int32_t iVar1;
  int32_t iVar2;
  w3Stack *this_00;
  
  this_00 = &this->super_w3Stack;
  iVar1 = w3Stack::pop_i32(this_00);
  iVar2 = w3Stack::pop_i32(this_00);
  w3Stack::push_bool(this_00,iVar1 == iVar2);
  return;
}

Assistant:

INTERP (Eq_i32_)
{
    push_bool (pop_i32 () == pop_i32 ());
}